

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void __thiscall
lodepng::ExtractZlib::generateFixedTrees(ExtractZlib *this,HuffmanTree *tree,HuffmanTree *treeD)

{
  long lVar1;
  allocator_type local_51;
  value_type_conflict2 local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlenD;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlen;
  
  bitlenD.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bitlen,0x120,(value_type_conflict2 *)&bitlenD,(allocator_type *)&local_50);
  local_50 = 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bitlenD,0x20,&local_50,&local_51);
  for (lVar1 = 0; lVar1 != 0x70; lVar1 = lVar1 + 1) {
    bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar1 + 0x90] = 9;
  }
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar1 + 0x100] = 7;
  }
  HuffmanTree::makeFromLengths(tree,&bitlen,0xf);
  HuffmanTree::makeFromLengths(treeD,&bitlenD,0xf);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&bitlenD.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void generateFixedTrees(HuffmanTree& tree, HuffmanTree& treeD) { //get the tree of a deflated block with fixed tree
    std::vector<unsigned long> bitlen(288, 8), bitlenD(32, 5);;
    for(size_t i = 144; i <= 255; i++) bitlen[i] = 9;
    for(size_t i = 256; i <= 279; i++) bitlen[i] = 7;
    tree.makeFromLengths(bitlen, 15);
    treeD.makeFromLengths(bitlenD, 15);
  }